

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void estimate_space_upto_test(bool multi_kv)

{
  fdb_status fVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  fdb_snapshot_marker_t in_stack_000001e0;
  fdb_file_handle *in_stack_000001e8;
  uint64_t *in_stack_00000218;
  fdb_snapshot_info_t **in_stack_00000220;
  fdb_file_handle *in_stack_00000228;
  void *pvVar5;
  fdb_file_handle *in_stack_fffffffffffff0b8;
  fdb_file_handle *in_stack_fffffffffffff0c0;
  fdb_snapshot_info_t *in_stack_fffffffffffff0c8;
  size_t in_stack_fffffffffffff0e0;
  fdb_kvs_config *in_stack_fffffffffffff260;
  char *in_stack_fffffffffffff268;
  fdb_kvs_handle **in_stack_fffffffffffff270;
  fdb_file_handle *in_stack_fffffffffffff278;
  fdb_config *in_stack_fffffffffffff2d8;
  char *in_stack_fffffffffffff2e0;
  fdb_file_handle **in_stack_fffffffffffff2e8;
  undefined8 auStack_5e8 [5];
  undefined1 *local_5c0;
  char *local_5b8;
  size_t local_5b0;
  char *local_5a8;
  size_t local_5a0;
  char *local_598;
  undefined1 *local_590;
  char *local_588;
  size_t local_580;
  char *local_578;
  size_t local_570;
  char *local_568;
  int local_55c;
  int local_558;
  int local_554;
  undefined1 *local_550;
  char *local_548;
  size_t local_540;
  char *local_538;
  size_t local_530;
  char *local_528;
  int local_51c;
  undefined1 *local_518;
  char *local_510;
  size_t local_508;
  char *local_500;
  size_t local_4f8;
  char *local_4f0;
  int local_4e4;
  size_t local_4e0;
  size_t space_used2_1;
  size_t space_used2;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char kv_name [8];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  size_t space_used;
  uint64_t num_markers;
  fdb_snapshot_info_t *markers;
  fdb_status status;
  fdb_doc **doc;
  fdb_kvs_handle **db;
  fdb_file_handle *dbfile;
  int num_kvs;
  int n;
  int r;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  bool multi_kv_local;
  
  auStack_5e8[3] = 0x107d90;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  auStack_5e8[3] = 0x107d9d;
  memleak_start();
  dbfile._4_4_ = 4;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x32;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fconfig.encryption_key.bytes[0x1c] = '\0';
  fconfig.encryption_key.bytes[0x1d] = '\0';
  fconfig.encryption_key.bytes[0x1e] = '\0';
  fconfig.encryption_key.bytes[0x1f] = '\0';
  fconfig._180_4_ = 0;
  fconfig.compactor_sleep_duration._0_1_ = multi_kv;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_open(in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
  if (multi_kv) {
    for (num_kvs = 0; num_kvs < 4; num_kvs = num_kvs + 1) {
      sprintf((char *)&fconfig.num_blocks_readahead,"kv%d",(ulong)(uint)num_kvs);
      fdb_kvs_open(in_stack_fffffffffffff278,in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                   in_stack_fffffffffffff260);
    }
  }
  else {
    dbfile._4_4_ = 1;
    fdb_kvs_open_default
              (in_stack_fffffffffffff0c0,&in_stack_fffffffffffff0b8->root,(fdb_kvs_config *)0x107ee7
              );
  }
  for (r = 0; local_4e4 = r, r < 0x4b; r = r + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)r);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)r);
    sprintf(kv_name,"body%d",(ulong)(uint)r);
    local_518 = &stack0xfffffffffffff0b8 + (long)r * 8;
    local_510 = metabuf + 0xf8;
    local_508 = strlen(metabuf + 0xf8);
    local_500 = bodybuf + 0xf8;
    local_4f8 = strlen(bodybuf + 0xf8);
    local_4f0 = kv_name;
    pvVar5 = (void *)0x107fcf;
    sVar2 = strlen(kv_name);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
                   (size_t)in_stack_fffffffffffff0b8,pvVar5,sVar2,(void *)0x108006,
                   in_stack_fffffffffffff0e0);
    for (num_kvs = 0; num_kvs < dbfile._4_4_; num_kvs = num_kvs + 1) {
      fdb_set((fdb_kvs_handle *)auStack_5e8[num_kvs],
              *(fdb_doc **)(&stack0xfffffffffffff0b8 + (long)r * 8));
    }
  }
  fdb_commit(in_stack_fffffffffffff0b8,'\0');
  for (; local_51c = r, r < 0x96; r = r + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)r);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)r);
    sprintf(kv_name,"body%d",(ulong)(uint)r);
    local_550 = &stack0xfffffffffffff0b8 + (long)r * 8;
    local_548 = metabuf + 0xf8;
    local_540 = strlen(metabuf + 0xf8);
    local_538 = bodybuf + 0xf8;
    local_530 = strlen(bodybuf + 0xf8);
    local_528 = kv_name;
    pvVar5 = (void *)0x108146;
    sVar2 = strlen(kv_name);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
                   (size_t)in_stack_fffffffffffff0b8,pvVar5,sVar2,(void *)0x10817d,
                   in_stack_fffffffffffff0e0);
    for (num_kvs = 0; num_kvs < dbfile._4_4_; num_kvs = num_kvs + 1) {
      fdb_set((fdb_kvs_handle *)auStack_5e8[num_kvs],
              *(fdb_doc **)(&stack0xfffffffffffff0b8 + (long)r * 8));
    }
  }
  for (n = 0; local_554 = n, n < 0x4b; n = n + 1) {
    for (num_kvs = 0; num_kvs < dbfile._4_4_; num_kvs = num_kvs + 1) {
      fdb_set((fdb_kvs_handle *)auStack_5e8[num_kvs],
              *(fdb_doc **)(&stack0xfffffffffffff0b8 + (long)n * 8));
    }
  }
  for (n = 0; local_558 = n, n < 0x4b; n = n + 1) {
    for (num_kvs = 0; num_kvs < dbfile._4_4_; num_kvs = num_kvs + 1) {
      fdb_set((fdb_kvs_handle *)auStack_5e8[num_kvs],
              *(fdb_doc **)(&stack0xfffffffffffff0b8 + (long)n * 8));
    }
  }
  fdb_commit(in_stack_fffffffffffff0b8,'\0');
  for (; local_55c = r, r < 0xe1; r = r + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)r);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)r);
    sprintf(kv_name,"body%d",(ulong)(uint)r);
    local_590 = &stack0xfffffffffffff0b8 + (long)r * 8;
    local_588 = metabuf + 0xf8;
    local_580 = strlen(metabuf + 0xf8);
    local_578 = bodybuf + 0xf8;
    local_570 = strlen(bodybuf + 0xf8);
    local_568 = kv_name;
    pvVar5 = (void *)0x1083ab;
    sVar2 = strlen(kv_name);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
                   (size_t)in_stack_fffffffffffff0b8,pvVar5,sVar2,(void *)0x1083e2,
                   in_stack_fffffffffffff0e0);
    for (num_kvs = 0; num_kvs < dbfile._4_4_; num_kvs = num_kvs + 1) {
      fdb_set((fdb_kvs_handle *)auStack_5e8[num_kvs],
              *(fdb_doc **)(&stack0xfffffffffffff0b8 + (long)r * 8));
    }
  }
  fdb_commit(in_stack_fffffffffffff0b8,'\0');
  for (; r < 300; r = r + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)r);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)r);
    sprintf(kv_name,"body%d",(ulong)(uint)r);
    local_5c0 = &stack0xfffffffffffff0b8 + (long)r * 8;
    local_5b8 = metabuf + 0xf8;
    local_5b0 = strlen(metabuf + 0xf8);
    local_5a8 = bodybuf + 0xf8;
    local_5a0 = strlen(bodybuf + 0xf8);
    local_598 = kv_name;
    pvVar5 = (void *)0x10850a;
    sVar2 = strlen(kv_name);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,
                   (size_t)in_stack_fffffffffffff0b8,pvVar5,sVar2,(void *)0x108541,
                   in_stack_fffffffffffff0e0);
    for (num_kvs = 0; num_kvs < dbfile._4_4_; num_kvs = num_kvs + 1) {
      fdb_set((fdb_kvs_handle *)auStack_5e8[num_kvs],
              *(fdb_doc **)(&stack0xfffffffffffff0b8 + (long)r * 8));
    }
  }
  fdb_commit(in_stack_fffffffffffff0b8,'\0');
  num_kvs = 0;
  do {
    if (dbfile._4_4_ <= num_kvs) {
      fVar1 = fdb_get_all_snap_markers(in_stack_00000228,in_stack_00000220,in_stack_00000218);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x361);
        estimate_space_upto_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x361,"void estimate_space_upto_test(bool)");
        }
      }
      if (multi_kv) {
        if (space_used != 8) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x36b);
          estimate_space_upto_test::__test_pass = 0;
          if (space_used != 8) {
            __assert_fail("num_markers == 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x36b,"void estimate_space_upto_test(bool)");
          }
        }
        sVar3 = fdb_estimate_space_used_from(in_stack_000001e8,in_stack_000001e0);
        local_4e0 = fdb_estimate_space_used_from(in_stack_000001e8,in_stack_000001e0);
        if (local_4e0 <= sVar3) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x36e);
          estimate_space_upto_test::__test_pass = 0;
          if (local_4e0 <= sVar3) {
            __assert_fail("space_used2 > space_used",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x36e,"void estimate_space_upto_test(bool)");
          }
        }
      }
      else {
        if (space_used != 4) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x365);
          estimate_space_upto_test::__test_pass = 0;
          if (space_used != 4) {
            __assert_fail("num_markers == 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x365,"void estimate_space_upto_test(bool)");
          }
        }
        sVar3 = fdb_estimate_space_used_from(in_stack_000001e8,in_stack_000001e0);
        space_used2_1 = fdb_estimate_space_used_from(in_stack_000001e8,in_stack_000001e0);
        if (space_used2_1 <= sVar3) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x368);
          estimate_space_upto_test::__test_pass = 0;
          if (space_used2_1 <= sVar3) {
            __assert_fail("space_used2 > space_used",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x368,"void estimate_space_upto_test(bool)");
          }
        }
      }
      fVar1 = fdb_free_snap_markers(in_stack_fffffffffffff0c8,(uint64_t)in_stack_fffffffffffff0c0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x372);
        estimate_space_upto_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x372,"void estimate_space_upto_test(bool)");
        }
      }
      fdb_close(in_stack_fffffffffffff0b8);
      for (r = 0; r < 300; r = r + 1) {
        fdb_doc_free((fdb_doc *)0x10899c);
      }
      fdb_shutdown();
      memleak_end();
      pcVar4 = "single kv mode:";
      if (multi_kv) {
        pcVar4 = "multiple kv mode:";
      }
      sprintf(kv_name,"estimate space upto marker in file test %s",pcVar4);
      if (estimate_space_upto_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n",kv_name);
      }
      else {
        fprintf(_stderr,"%s PASSED\n",kv_name);
      }
      return;
    }
    fVar1 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_5e8[num_kvs],logCallbackFunc,
                       "estimate_space_upto_test");
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x35d);
      estimate_space_upto_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x35d,"void estimate_space_upto_test(bool)");
      }
    }
    num_kvs = num_kvs + 1;
  } while( true );
}

Assistant:

void estimate_space_upto_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int n = 300;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_snapshot_info_t *markers;
    uint64_t num_markers;
    size_t space_used;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 50;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    fconfig.block_reusing_threshold = 0;

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

   // ------- Setup test ----------------------------------
   // insert first quarter of documents
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert second quarter of documents
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // Update first quarter of documents again..
    for (j = 0; j < n/4; j++){
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[j]);
        }
    }
    // Update first quarter of documents again overwriting previous update..
    for (j = 0; j < n/4; j++){
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[j]);
        }
    }

    // commit again without a WAL flush (some of these docs remain in WAL)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert third quarter of documents
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert fourth quarter of documents
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush (some of these docs remain in the WAL)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "estimate_space_upto_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    if (!multi_kv) {
        size_t space_used2;
        TEST_CHK(num_markers == 4);
        space_used = fdb_estimate_space_used_from(dbfile, markers[1].marker);
        space_used2 = fdb_estimate_space_used_from(dbfile, markers[2].marker);
        TEST_CHK(space_used2 > space_used); // greater than space used by just 1
    } else {
        size_t space_used2;
        TEST_CHK(num_markers == 8);
        space_used = fdb_estimate_space_used_from(dbfile, markers[1].marker);
        space_used2 = fdb_estimate_space_used_from(dbfile, markers[2].marker);
        TEST_CHK(space_used2 > space_used); // greater than space used by just 1
    }

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "estimate space upto marker in file test %s", multi_kv ?
                                                           "multiple kv mode:"
                                                         : "single kv mode:");
    TEST_RESULT(bodybuf);
}